

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O2

int lib::io::Seek(State *state)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  UserData *pUVar3;
  String *this;
  long lVar4;
  int iVar5;
  double dVar6;
  StackAPI api;
  string whence;
  
  luna::StackAPI::StackAPI(&api,state);
  iVar5 = 2;
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&api,1,ValueT_UserData,ValueT_String,ValueT_Number);
  if (!bVar1) {
    return 0;
  }
  pUVar3 = luna::StackAPI::GetUserData(&api,0);
  __stream = (FILE *)pUVar3->user_data_;
  iVar2 = luna::StackAPI::GetStackSize(&api);
  if (iVar2 < 2) goto LAB_001287b0;
  this = luna::StackAPI::GetString(&api,1);
  luna::String::GetStdString_abi_cxx11_(&whence,this);
  if (iVar2 == 2) {
    lVar4 = 0;
  }
  else {
    dVar6 = luna::StackAPI::GetNumber(&api,2);
    lVar4 = (long)dVar6;
  }
  bVar1 = std::operator==(&whence,"set");
  iVar2 = 0;
  if ((bVar1) || (bVar1 = std::operator==(&whence,"cur"), iVar2 = 1, bVar1)) {
LAB_0012877e:
    iVar2 = fseek(__stream,lVar4,iVar2);
    if (iVar2 != 0) {
      PushError(&api);
      std::__cxx11::string::~string((string *)&whence);
      return 2;
    }
  }
  else {
    bVar1 = std::operator==(&whence,"end");
    if (bVar1) {
      iVar2 = 2;
      goto LAB_0012877e;
    }
  }
  std::__cxx11::string::~string((string *)&whence);
LAB_001287b0:
  lVar4 = ftell(__stream);
  if (lVar4 < 0) {
    PushError(&api);
  }
  else {
    luna::StackAPI::PushNumber(&api,(double)lVar4);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Seek(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_UserData,
                           luna::ValueT_String, luna::ValueT_Number))
            return 0;

        auto user_data = api.GetUserData(0);
        auto file = reinterpret_cast<std::FILE *>(user_data->GetData());

        auto params = api.GetStackSize();
        if (params > 1)
        {
            auto whence = api.GetString(1)->GetStdString();
            long offset = 0;
            if (params > 2)
                offset = static_cast<long>(api.GetNumber(2));

            int res = 0;
            if (whence == "set")
                res = std::fseek(file, offset, SEEK_SET);
            else if (whence == "cur")
                res = std::fseek(file, offset, SEEK_CUR);
            else if (whence == "end")
                res = std::fseek(file, offset, SEEK_END);

            if (res != 0)
                return PushError(api);
        }

        auto pos = std::ftell(file);
        if (pos < 0)
            return PushError(api);

        api.PushNumber(pos);
        return 1;
    }